

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhash.h
# Opt level: O0

mh_int_t mh_assoc_find(mh_assoc_t *h,assoc_key *key,void *arg)

{
  mh_int_t mVar1;
  uint32_t uVar2;
  int iVar3;
  uint local_30;
  mh_int_t inc;
  mh_int_t i;
  mh_int_t k;
  void *arg_local;
  assoc_key *key_local;
  mh_assoc_t *h_local;
  
  uVar2 = PMurHash32(0xd,key->id,key->id_len);
  local_30 = uVar2 % h->n_buckets;
  mVar1 = h->n_buckets;
  while (((h->b[local_30 >> 4] & 1 << ((byte)local_30 & 0xf)) == 0 ||
         (iVar3 = mh_cmp_key_eq(key,h->p + local_30,arg), iVar3 == 0))) {
    if ((h->b[local_30 >> 4] & 1 << (((byte)local_30 & 0xf) + 0x10 & 0x1f)) == 0) {
      return h->n_buckets;
    }
    local_30 = mh_assoc_next_slot(local_30,uVar2 % (mVar1 - 1) + 1,h->n_buckets);
  }
  return local_30;
}

Assistant:

static inline mh_int_t
_mh(find)(struct _mh(t) *h, mh_key_t key, mh_arg_t arg)
{
	(void) arg;

	mh_int_t k = mh_hash_key(key, arg);
	mh_int_t i = k % h->n_buckets;
	mh_int_t inc = 1 + k % (h->n_buckets - 1);
	for (;;) {
		if ((mh_exist(h, i) && mh_eq_key(key, mh_node(h, i), arg)))
			return i;

		if (!mh_dirty(h, i))
			return h->n_buckets;

		i = _mh(next_slot)(i, inc, h->n_buckets);
	}
}